

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaD_call(lua_State *L,StkId func,int nResults)

{
  ushort uVar1;
  int iVar2;
  int nResults_local;
  StkId func_local;
  lua_State *L_local;
  
  uVar1 = L->nCcalls + 1;
  L->nCcalls = uVar1;
  if (199 < uVar1) {
    if (L->nCcalls == 200) {
      luaG_runerror(L,"C stack overflow");
    }
    else if (0xe0 < L->nCcalls) {
      luaD_throw(L,5);
    }
  }
  iVar2 = luaD_precall(L,func,nResults);
  if (iVar2 == 0) {
    luaV_execute(L,1);
  }
  L->nCcalls = L->nCcalls - 1;
  if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
    luaC_step(L);
  }
  return;
}

Assistant:

static void luaD_call(lua_State*L,StkId func,int nResults){
if(++L->nCcalls>=200){
if(L->nCcalls==200)
luaG_runerror(L,"C stack overflow");
else if(L->nCcalls>=(200+(200>>3)))
luaD_throw(L,5);
}
if(luaD_precall(L,func,nResults)==0)
luaV_execute(L,1);
L->nCcalls--;
luaC_checkGC(L);
}